

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sgsisx.c
# Opt level: O3

void sgsisx(superlu_options_t *options,SuperMatrix *A,int *perm_c,int *perm_r,int *etree,char *equed
           ,float *R,float *C,SuperMatrix *L,SuperMatrix *U,void *work,int_t lwork,SuperMatrix *B,
           SuperMatrix *X,float *recip_pivot_growth,float *rcond,GlobalLU_t *Glu,
           mem_usage_t *mem_usage,SuperLUStat_t *stat,int_t *info)

{
  float fVar1;
  char cVar2;
  uint uVar3;
  trans_t tVar4;
  yes_no_t yVar5;
  int iVar6;
  int_t nnz;
  uint uVar7;
  int *piVar8;
  int_t *piVar9;
  bool bVar10;
  double *pdVar11;
  int iVar12;
  long lVar13;
  int *piVar14;
  undefined1 uVar15;
  long lVar16;
  ulong uVar17;
  int iVar18;
  long lVar19;
  ulong uVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  float in_XMM0_Da;
  float fVar24;
  float fVar25;
  double dVar26;
  double dVar27;
  float in_XMM1_Da;
  SuperMatrix *local_200;
  int *local_1f8;
  int info1;
  float rowcnd;
  float colcnd;
  int_t *local_1d8;
  ulong local_1d0;
  double local_1c8;
  double *local_1c0;
  int_t *local_1b8;
  int *local_1b0;
  long local_1a8;
  trans_t local_1a0;
  fact_t local_19c;
  int *local_198;
  long local_190;
  long local_188;
  int *local_180;
  int local_174;
  int local_170;
  float amax;
  float *local_168;
  double local_160;
  SuperMatrix AC;
  char norm [1];
  undefined3 uStack_137;
  
  piVar14 = (int *)B->Store;
  piVar8 = (int *)X->Store;
  local_1c8 = *(double *)(piVar14 + 2);
  local_1a8 = *(long *)(piVar8 + 2);
  local_190 = (long)*piVar14;
  local_188 = (long)*piVar8;
  local_1d0 = (ulong)(uint)B->ncol;
  uVar3 = B->nrow;
  lVar13 = (long)(int)uVar3;
  *info = 0;
  tVar4 = options->Trans;
  bVar21 = tVar4 == NOTRANS;
  local_19c = options->Fact;
  yVar5 = options->Equil;
  local_1b8 = (int_t *)CONCAT44(local_1b8._4_4_,options->RowPerm);
  local_1b0 = perm_c;
  local_198 = perm_r;
  local_180 = etree;
  if (local_19c == FACTORED) {
    cVar2 = *equed;
    bVar22 = true;
    if (cVar2 == 'R') {
LAB_0010894e:
      bVar23 = cVar2 == 'B';
    }
    else {
      bVar22 = cVar2 == 'B';
      bVar23 = true;
      if (cVar2 != 'C') goto LAB_0010894e;
    }
    in_XMM0_Da = smach("Safe minimum");
    in_XMM1_Da = 1.0 / in_XMM0_Da;
  }
  else {
    *equed = 'N';
    bVar22 = false;
    bVar23 = false;
  }
  iVar12 = -1;
  if (((options->Fact < 4) && (options->Trans < (CONJ|TRANS))) && (options->Equil < 2)) {
    iVar6 = A->nrow;
    iVar12 = -2;
    if (((-1 < (long)iVar6) && (iVar6 == A->ncol)) &&
       (((A->Stype & ~SLU_NR) == SLU_NC && ((A->Dtype == SLU_S && (A->Mtype == SLU_GE)))))) {
      if ((options->Fact != FACTORED) || (bVar23 || bVar22)) {
        if (bVar22) {
          if (iVar6 == 0) {
            iVar12 = -7;
            if (0.0 < in_XMM1_Da) {
LAB_00108aaa:
              rowcnd = 1.0;
              goto LAB_00108ab2;
            }
          }
          else {
            fVar24 = 0.0;
            lVar19 = 0;
            fVar25 = in_XMM1_Da;
            do {
              fVar1 = R[lVar19];
              if (fVar1 <= fVar25) {
                fVar25 = fVar1;
              }
              if (fVar24 <= fVar1) {
                fVar24 = fVar1;
              }
              lVar19 = lVar19 + 1;
            } while (iVar6 != lVar19);
            iVar12 = -7;
            if (0.0 < fVar25) {
              if (iVar6 == 0) goto LAB_00108aaa;
              if (fVar25 <= in_XMM0_Da) {
                fVar25 = in_XMM0_Da;
              }
              if (in_XMM1_Da <= fVar24) {
                fVar24 = in_XMM1_Da;
              }
              rowcnd = fVar25 / fVar24;
              goto LAB_00108ab2;
            }
          }
        }
        else {
LAB_00108ab2:
          iVar12 = *info;
          if (!bVar23) goto LAB_00108b1d;
          if (iVar12 != 0) goto LAB_001089e8;
          iVar6 = A->nrow;
          if ((long)iVar6 < 1) {
            iVar12 = -8;
            if (0.0 < in_XMM1_Da) {
LAB_00108be0:
              colcnd = 1.0;
              goto LAB_00108b25;
            }
          }
          else {
            fVar24 = 0.0;
            lVar19 = 0;
            fVar25 = in_XMM1_Da;
            do {
              fVar1 = C[lVar19];
              if (fVar1 <= fVar25) {
                fVar25 = fVar1;
              }
              if (fVar24 <= fVar1) {
                fVar24 = fVar1;
              }
              lVar19 = lVar19 + 1;
            } while (iVar6 != lVar19);
            iVar12 = -8;
            if (0.0 < fVar25) {
              if (iVar6 < 1) goto LAB_00108be0;
              if (fVar25 <= in_XMM0_Da) {
                fVar25 = in_XMM0_Da;
              }
              if (in_XMM1_Da <= fVar24) {
                fVar24 = in_XMM1_Da;
              }
              colcnd = fVar25 / fVar24;
LAB_00108b25:
              iVar12 = -0xc;
              if (-2 < lwork) {
                iVar6 = B->ncol;
                iVar12 = -0xd;
                if (-1 < iVar6) {
                  iVar18 = 0;
                  if (0 < A->nrow) {
                    iVar18 = A->nrow;
                  }
                  if ((((iVar18 <= *piVar14) && (B->Stype == SLU_DN)) && (B->Dtype == SLU_S)) &&
                     (B->Mtype == SLU_GE)) {
                    iVar12 = -0xe;
                    if ((((-1 < X->ncol) && (iVar18 <= *piVar8)) &&
                        ((iVar6 == 0 || iVar6 == X->ncol &&
                         ((X->Stype == SLU_DN && (X->Dtype == SLU_S)))))) && (X->Mtype == SLU_GE)) {
                      local_170 = sp_ienv(1);
                      local_174 = sp_ienv(2);
                      local_1c0 = stat->utime;
                      if (A->Stype == SLU_NR) {
                        bVar21 = tVar4 != NOTRANS;
                        local_1a0 = (trans_t)(tVar4 == NOTRANS);
                        piVar9 = (int_t *)A->Store;
                        local_200 = (SuperMatrix *)superlu_malloc(0x20);
                        sCreate_CompCol_Matrix
                                  (local_200,A->ncol,A->nrow,*piVar9,*(float **)(piVar9 + 2),
                                   *(int_t **)(piVar9 + 4),*(int_t **)(piVar9 + 6),SLU_NC,A->Dtype,
                                   A->Mtype);
                      }
                      else {
                        local_1a0 = options->Trans;
                        local_200 = A;
                      }
                      if (local_19c == FACTORED) goto LAB_001091c8;
                      if ((int)local_1b8 == 1) {
                        piVar9 = (int_t *)local_200->Store;
                        nnz = *piVar9;
                        local_1d8 = *(int_t **)(piVar9 + 6);
                        local_1b8 = *(int_t **)(piVar9 + 4);
                        local_168 = *(float **)(piVar9 + 2);
                        local_160 = SuperLU_timer_();
                        local_1f8 = int32Malloc(uVar3);
                        if (local_1f8 == (int *)0x0) {
                          sprintf(norm,"%s at line %d in file %s\n",
                                  "SUPERLU_MALLOC fails for perm[]",0x227,
                                  "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/sgsisx.c"
                                 );
                          superlu_abort_and_exit(norm);
                        }
                        info1 = sldperm(5,uVar3,nnz,local_1d8,local_1b8,local_168,local_1f8,R,C);
                        bVar10 = info1 != 0;
                        if (info1 == 0) {
                          if (yVar5 == YES) {
                            if (0 < (int)uVar3) {
                              lVar19 = 0;
                              do {
                                dVar26 = exp((double)R[lVar19]);
                                R[lVar19] = (float)dVar26;
                                dVar26 = exp((double)C[lVar19]);
                                C[lVar19] = (float)dVar26;
                                lVar19 = lVar19 + 1;
                              } while (lVar13 != lVar19);
                              if (0 < (int)uVar3) {
                                lVar19 = 0;
                                iVar12 = *local_1d8;
                                do {
                                  iVar6 = local_1d8[lVar19 + 1];
                                  if (iVar12 < iVar6) {
                                    lVar16 = (long)iVar12;
                                    do {
                                      local_168[lVar16] =
                                           R[local_1b8[lVar16]] * C[lVar19] * local_168[lVar16];
                                      lVar16 = lVar16 + 1;
                                    } while (iVar6 != lVar16);
                                  }
                                  lVar19 = lVar19 + 1;
                                  iVar12 = iVar6;
                                } while (lVar19 != lVar13);
                              }
                            }
                            *equed = 'B';
                            bVar22 = true;
                            bVar23 = true;
                          }
                          if (0 < (int)uVar3) {
                            iVar12 = *local_1d8;
                            lVar19 = 0;
                            do {
                              lVar16 = lVar19 + 1;
                              lVar19 = lVar19 + 1;
                              iVar6 = local_1d8[lVar16];
                              if (iVar12 < local_1d8[lVar16]) {
                                lVar16 = (long)iVar12;
                                do {
                                  local_1b8[lVar16] = local_1f8[local_1b8[lVar16]];
                                  lVar16 = lVar16 + 1;
                                  iVar6 = local_1d8[lVar19];
                                } while (lVar16 < local_1d8[lVar19]);
                              }
                              iVar12 = iVar6;
                            } while (lVar19 != lVar13);
                          }
                        }
                        else {
                          superlu_free(local_1f8);
                          local_1f8 = (int *)0x0;
                        }
                        dVar26 = SuperLU_timer_();
                        local_1c0[4] = dVar26 - local_160;
                      }
                      else {
                        local_1f8 = (int *)0x0;
                        bVar10 = true;
                      }
                      if ((bool)(yVar5 == YES & bVar10)) {
                        dVar26 = SuperLU_timer_();
                        sgsequ(local_200,R,C,&rowcnd,&colcnd,&amax,&info1);
                        if (info1 == 0) {
                          slaqgs(local_200,R,C,rowcnd,colcnd,amax,equed);
                          cVar2 = *equed;
                          bVar22 = true;
                          if (cVar2 != 'R') {
                            bVar22 = cVar2 == 'B';
                            bVar23 = true;
                            if (cVar2 == 'C') goto LAB_00108fb9;
                          }
                          bVar23 = cVar2 == 'B';
                        }
LAB_00108fb9:
                        dVar27 = SuperLU_timer_();
                        local_1c0[4] = dVar27 - dVar26;
                      }
                      dVar26 = SuperLU_timer_();
                      if ((options->ColPerm != MY_PERMC) && (options->Fact == DOFACT)) {
                        get_perm_c(options->ColPerm,local_200,local_1b0);
                      }
                      dVar27 = SuperLU_timer_();
                      pdVar11 = local_1c0;
                      *local_1c0 = dVar27 - dVar26;
                      dVar26 = SuperLU_timer_();
                      piVar14 = local_180;
                      sp_preorder(options,local_200,local_1b0,local_180,&AC);
                      dVar27 = SuperLU_timer_();
                      pdVar11[3] = dVar27 - dVar26;
                      dVar26 = SuperLU_timer_();
                      sgsitrf(options,&AC,local_174,local_170,piVar14,work,lwork,local_1b0,local_198
                              ,L,U,Glu,stat,info);
                      dVar27 = SuperLU_timer_();
                      pdVar11[7] = dVar27 - dVar26;
                      if (lwork == -1) {
                        mem_usage->total_needed = (float)(*info - A->ncol);
                        return;
                      }
                      if (!bVar10) {
                        uVar7 = *local_200->Store;
                        lVar19 = *(long *)((long)local_200->Store + 0x10);
                        piVar14 = int32Malloc(uVar3 * 2);
                        if (piVar14 == (int *)0x0) {
                          sprintf(norm,"%s at line %d in file %s\n",
                                  "SUPERLU_MALLOC fails for perm_tmp[]",0x27e,
                                  "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/sgsisx.c"
                                 );
                          superlu_abort_and_exit(norm);
                        }
                        if (0 < (int)uVar3) {
                          lVar16 = 0;
                          do {
                            piVar14[lVar16] = local_198[local_1f8[lVar16]];
                            lVar16 = lVar16 + 1;
                          } while (lVar13 != lVar16);
                          if (0 < (int)uVar3) {
                            lVar16 = 0;
                            do {
                              local_198[lVar16] = piVar14[lVar16];
                              piVar14[lVar13 + local_1f8[lVar16]] = (int)lVar16;
                              lVar16 = lVar16 + 1;
                            } while (lVar13 != lVar16);
                          }
                        }
                        if (0 < (int)uVar7) {
                          uVar17 = 0;
                          do {
                            *(int *)(lVar19 + uVar17 * 4) =
                                 piVar14[lVar13 + *(int *)(lVar19 + uVar17 * 4)];
                            uVar17 = uVar17 + 1;
                          } while (uVar7 != uVar17);
                        }
                        superlu_free(local_1f8);
                        superlu_free(piVar14);
                      }
LAB_001091c8:
                      if (options->PivotGrowth != NO) {
                        if (0 < *info) {
                          return;
                        }
                        fVar24 = sPivotGrowth(A->ncol,local_200,local_1b0,L,U);
                        *recip_pivot_growth = fVar24;
                      }
                      if (options->ConditionNumber != NO) {
                        local_180 = (int *)SuperLU_timer_();
                        uVar15 = 0x49;
                        if (bVar21) {
                          uVar15 = 0x31;
                        }
                        _norm = CONCAT31(uStack_137,uVar15);
                        fVar24 = slangs(norm,local_200);
                        sgscon(norm,L,U,fVar24,rcond,stat,&info1);
                        dVar26 = SuperLU_timer_();
                        local_1c0[0x10] = dVar26 - (double)local_180;
                      }
                      if (0 < (int)local_1d0) {
                        if (bVar21) {
                          if (bVar22) {
                            uVar17 = 0;
                            dVar26 = local_1c8;
                            do {
                              if (0 < (int)uVar3) {
                                uVar20 = 0;
                                do {
                                  *(float *)((long)dVar26 + uVar20 * 4) =
                                       R[uVar20] * *(float *)((long)dVar26 + uVar20 * 4);
                                  uVar20 = uVar20 + 1;
                                } while (uVar3 != uVar20);
                              }
                              uVar17 = uVar17 + 1;
                              dVar26 = (double)((long)dVar26 + local_190 * 4);
                            } while (uVar17 != local_1d0);
                          }
                        }
                        else if (bVar23) {
                          uVar17 = 0;
                          dVar26 = local_1c8;
                          do {
                            if (0 < (int)uVar3) {
                              uVar20 = 0;
                              do {
                                *(float *)((long)dVar26 + uVar20 * 4) =
                                     C[uVar20] * *(float *)((long)dVar26 + uVar20 * 4);
                                uVar20 = uVar20 + 1;
                              } while (uVar3 != uVar20);
                            }
                            uVar17 = uVar17 + 1;
                            dVar26 = (double)((long)dVar26 + local_190 * 4);
                          } while (uVar17 != local_1d0);
                        }
                        uVar7 = B->nrow;
                        local_188 = local_188 * 4;
                        local_190 = local_190 * 4;
                        uVar17 = 0;
                        lVar13 = local_1a8;
                        do {
                          if (0 < (int)uVar7) {
                            uVar20 = 0;
                            do {
                              *(undefined4 *)(lVar13 + uVar20 * 4) =
                                   *(undefined4 *)((long)local_1c8 + uVar20 * 4);
                              uVar20 = uVar20 + 1;
                            } while (uVar7 != uVar20);
                          }
                          uVar17 = uVar17 + 1;
                          lVar13 = lVar13 + local_188;
                          local_1c8 = (double)((long)local_1c8 + local_190);
                        } while (uVar17 != local_1d0);
                        local_1c8 = SuperLU_timer_();
                        sgstrs(local_1a0,L,U,local_1b0,local_198,X,stat,&info1);
                        dVar26 = SuperLU_timer_();
                        local_1c0[0x11] = dVar26 - local_1c8;
                        if (bVar21) {
                          if (bVar23) {
                            uVar17 = 0;
                            do {
                              if (0 < (int)uVar3) {
                                uVar20 = 0;
                                do {
                                  *(float *)(local_1a8 + uVar20 * 4) =
                                       C[uVar20] * *(float *)(local_1a8 + uVar20 * 4);
                                  uVar20 = uVar20 + 1;
                                } while (uVar3 != uVar20);
                              }
                              uVar17 = uVar17 + 1;
                              local_1a8 = local_1a8 + local_188;
                            } while (uVar17 != local_1d0);
                          }
                        }
                        else if (bVar22) {
                          uVar3 = A->nrow;
                          uVar17 = 0;
                          do {
                            if (0 < (int)uVar3) {
                              uVar20 = 0;
                              do {
                                *(float *)(local_1a8 + uVar20 * 4) =
                                     R[uVar20] * *(float *)(local_1a8 + uVar20 * 4);
                                uVar20 = uVar20 + 1;
                              } while (uVar3 != uVar20);
                            }
                            uVar17 = uVar17 + 1;
                            local_1a8 = local_1a8 + local_188;
                          } while (uVar17 != local_1d0);
                        }
                      }
                      if (((options->ConditionNumber != NO) &&
                          (fVar24 = *rcond, fVar25 = smach("E"), fVar24 < fVar25)) && (*info == 0))
                      {
                        *info = A->ncol + 1;
                      }
                      if (local_19c != FACTORED) {
                        ilu_sQuerySpace(L,U,mem_usage);
                        Destroy_CompCol_Permuted(&AC);
                      }
                      if (A->Stype != SLU_NR) {
                        return;
                      }
                      Destroy_SuperMatrix_Store(local_200);
                      superlu_free(local_200);
                      return;
                    }
                  }
                }
              }
            }
          }
        }
      }
      else {
        iVar12 = -6;
        if (*equed == 'N') {
          iVar12 = *info;
LAB_00108b1d:
          if (iVar12 != 0) goto LAB_001089e8;
          goto LAB_00108b25;
        }
      }
    }
  }
  *info = iVar12;
LAB_001089e8:
  _norm = -iVar12;
  input_error("sgsisx",(int *)norm);
  return;
}

Assistant:

void
sgsisx(superlu_options_t *options, SuperMatrix *A, int *perm_c, int *perm_r,
       int *etree, char *equed, float *R, float *C,
       SuperMatrix *L, SuperMatrix *U, void *work, int_t lwork,
       SuperMatrix *B, SuperMatrix *X,
       float *recip_pivot_growth, float *rcond,
       GlobalLU_t *Glu, mem_usage_t *mem_usage, SuperLUStat_t *stat, int_t *info)
{

    DNformat  *Bstore, *Xstore;
    float    *Bmat, *Xmat;
    int       ldb, ldx, nrhs, n;
    SuperMatrix *AA;/* A in SLU_NC format used by the factorization routine.*/
    SuperMatrix AC; /* Matrix postmultiplied by Pc */
    int       colequ, equil, nofact, notran, rowequ, permc_spec, mc64;
    trans_t   trant;
    char      norm[1];
    int_t     i, j;
    float    amax, anorm, bignum, smlnum, colcnd, rowcnd, rcmax, rcmin;
    int       relax, panel_size, info1;
    double    t0;      /* temporary time */
    double    *utime;

    int *perm = NULL; /* permutation returned from MC64 */

    /* External functions */
    extern float slangs(char *, SuperMatrix *);

    Bstore = B->Store;
    Xstore = X->Store;
    Bmat   = Bstore->nzval;
    Xmat   = Xstore->nzval;
    ldb    = Bstore->lda;
    ldx    = Xstore->lda;
    nrhs   = B->ncol;
    n      = B->nrow;

    *info = 0;
    nofact = (options->Fact != FACTORED);
    equil = (options->Equil == YES);
    notran = (options->Trans == NOTRANS);
    mc64 = (options->RowPerm == LargeDiag_MC64);
    if ( nofact ) {
	*(unsigned char *)equed = 'N';
	rowequ = FALSE;
	colequ = FALSE;
    } else {
	rowequ = strncmp(equed, "R", 1)==0 || strncmp(equed, "B", 1)==0;
	colequ = strncmp(equed, "C", 1)==0 || strncmp(equed, "B", 1)==0;
	smlnum = smach("Safe minimum");  /* lamch_("Safe minimum"); */
	bignum = 1. / smlnum;
    }

    /* Test the input parameters */
    if ( (options->Fact != DOFACT && options->Fact != SamePattern &&
	  options->Fact != SamePattern_SameRowPerm &&
	  options->Fact != FACTORED) ||
	 (options->Trans != NOTRANS && options->Trans != TRANS && 
	  options->Trans != CONJ) ||
	 (options->Equil != NO && options->Equil != YES) )
	*info = -1;
    else if ( A->nrow != A->ncol || A->nrow < 0 ||
	      (A->Stype != SLU_NC && A->Stype != SLU_NR) ||
	      A->Dtype != SLU_S || A->Mtype != SLU_GE )
	*info = -2;
    else if ( options->Fact == FACTORED &&
	     !(rowequ || colequ || strncmp(equed, "N", 1)==0) )
	*info = -6;
    else {
	if (rowequ) {
	    rcmin = bignum;
	    rcmax = 0.;
	    for (j = 0; j < A->nrow; ++j) {
		rcmin = SUPERLU_MIN(rcmin, R[j]);
		rcmax = SUPERLU_MAX(rcmax, R[j]);
	    }
	    if (rcmin <= 0.) *info = -7;
	    else if ( A->nrow > 0)
		rowcnd = SUPERLU_MAX(rcmin,smlnum) / SUPERLU_MIN(rcmax,bignum);
	    else rowcnd = 1.;
	}
	if (colequ && *info == 0) {
	    rcmin = bignum;
	    rcmax = 0.;
	    for (j = 0; j < A->nrow; ++j) {
		rcmin = SUPERLU_MIN(rcmin, C[j]);
		rcmax = SUPERLU_MAX(rcmax, C[j]);
	    }
	    if (rcmin <= 0.) *info = -8;
	    else if (A->nrow > 0)
		colcnd = SUPERLU_MAX(rcmin,smlnum) / SUPERLU_MIN(rcmax,bignum);
	    else colcnd = 1.;
	}
	if (*info == 0) {
	    if ( lwork < -1 ) *info = -12;
	    else if ( B->ncol < 0 || Bstore->lda < SUPERLU_MAX(0, A->nrow) ||
		      B->Stype != SLU_DN || B->Dtype != SLU_S || 
		      B->Mtype != SLU_GE )
		*info = -13;
	    else if ( X->ncol < 0 || Xstore->lda < SUPERLU_MAX(0, A->nrow) ||
		      (B->ncol != 0 && B->ncol != X->ncol) ||
		      X->Stype != SLU_DN ||
		      X->Dtype != SLU_S || X->Mtype != SLU_GE )
		*info = -14;
	}
    }
    if (*info != 0) {
	int ii = -(*info);
	input_error("sgsisx", &ii);
	return;
    }

    /* Initialization for factor parameters */
    panel_size = sp_ienv(1);
    relax      = sp_ienv(2);

    utime = stat->utime;

    /* Convert A to SLU_NC format when necessary. */
    if ( A->Stype == SLU_NR ) {
	NRformat *Astore = A->Store;
	AA = (SuperMatrix *) SUPERLU_MALLOC( sizeof(SuperMatrix) );
	sCreate_CompCol_Matrix(AA, A->ncol, A->nrow, Astore->nnz,
			       Astore->nzval, Astore->colind, Astore->rowptr,
			       SLU_NC, A->Dtype, A->Mtype);
	if ( notran ) { /* Reverse the transpose argument. */
	    trant = TRANS;
	    notran = 0;
	} else {
	    trant = NOTRANS;
	    notran = 1;
	}
    } else { /* A->Stype == SLU_NC */
	trant = options->Trans;
	AA = A;
    }

    if ( nofact ) {
	register int i, j;
	NCformat *Astore = AA->Store;
	int_t nnz = Astore->nnz;
	int_t *colptr = Astore->colptr;
	int_t *rowind = Astore->rowind;
	float *nzval = (float *)Astore->nzval;

	if ( mc64 ) {
	    t0 = SuperLU_timer_();
	    if ((perm = int32Malloc(n)) == NULL)
		ABORT("SUPERLU_MALLOC fails for perm[]");

	    info1 = sldperm(5, n, nnz, colptr, rowind, nzval, perm, R, C);

	    if (info1 != 0) { /* MC64 fails, call sgsequ() later */
		mc64 = 0;
		SUPERLU_FREE(perm);
		perm = NULL;
	    } else {
	        if ( equil ) {
	            rowequ = colequ = 1;
		    for (i = 0; i < n; i++) {
		        R[i] = exp(R[i]);
		        C[i] = exp(C[i]);
		    }
		    /* scale the matrix */
		    for (j = 0; j < n; j++) {
		        for (i = colptr[j]; i < colptr[j + 1]; i++) {
			    nzval[i] *= R[rowind[i]] * C[j];
		        }
		    }
	            *equed = 'B';
                }

                /* permute the matrix */
		for (j = 0; j < n; j++) {
		    for (i = colptr[j]; i < colptr[j + 1]; i++) {
			/*nzval[i] *= R[rowind[i]] * C[j];*/
			rowind[i] = perm[rowind[i]];
		    }
		}
	    }
	    utime[EQUIL] = SuperLU_timer_() - t0;
	}

	if ( mc64==0 && equil ) { /* Only perform equilibration, no row perm */
	    t0 = SuperLU_timer_();
	    /* Compute row and column scalings to equilibrate the matrix A. */
	    sgsequ(AA, R, C, &rowcnd, &colcnd, &amax, &info1);

	    if ( info1 == 0 ) {
		/* Equilibrate matrix A. */
		slaqgs(AA, R, C, rowcnd, colcnd, amax, equed);
		rowequ = strncmp(equed, "R", 1)==0 || strncmp(equed, "B", 1)==0;
		colequ = strncmp(equed, "C", 1)==0 || strncmp(equed, "B", 1)==0;
	    }
	    utime[EQUIL] = SuperLU_timer_() - t0;
	}
    }


    if ( nofact ) {
	
	t0 = SuperLU_timer_();
	/*
	 * Gnet column permutation vector perm_c[], according to permc_spec:
	 *   permc_spec = NATURAL:  natural ordering 
	 *   permc_spec = MMD_AT_PLUS_A: minimum degree on structure of A'+A
	 *   permc_spec = MMD_ATA:  minimum degree on structure of A'*A
	 *   permc_spec = COLAMD:   approximate minimum degree column ordering
	 *   permc_spec = MY_PERMC: the ordering already supplied in perm_c[]
	 */
	permc_spec = options->ColPerm;
	if ( permc_spec != MY_PERMC && options->Fact == DOFACT )
	    get_perm_c(permc_spec, AA, perm_c);
	utime[COLPERM] = SuperLU_timer_() - t0;

	t0 = SuperLU_timer_();
	sp_preorder(options, AA, perm_c, etree, &AC);
	utime[ETREE] = SuperLU_timer_() - t0;

	/* Compute the LU factorization of A*Pc. */
	t0 = SuperLU_timer_();
	sgsitrf(options, &AC, relax, panel_size, etree, work, lwork,
                perm_c, perm_r, L, U, Glu, stat, info);
	utime[FACT] = SuperLU_timer_() - t0;

	if ( lwork == -1 ) {
	    mem_usage->total_needed = *info - A->ncol;
	    return;
	}

	if ( mc64 ) { /* Fold MC64's perm[] into perm_r[]. */
	    NCformat *Astore = AA->Store;
	    int_t nnz = Astore->nnz, *rowind = Astore->rowind;
	    int *perm_tmp, *iperm;
	    if ((perm_tmp = int32Malloc(2*n)) == NULL)
		ABORT("SUPERLU_MALLOC fails for perm_tmp[]");
	    iperm = perm_tmp + n;
	    for (i = 0; i < n; ++i) perm_tmp[i] = perm_r[perm[i]];
	    for (i = 0; i < n; ++i) {
		perm_r[i] = perm_tmp[i];
		iperm[perm[i]] = i;
	    }

	    /* Restore A's original row indices. */
	    for (i = 0; i < nnz; ++i) rowind[i] = iperm[rowind[i]];

	    SUPERLU_FREE(perm); /* MC64 permutation */
	    SUPERLU_FREE(perm_tmp);
	}
    }

    if ( options->PivotGrowth ) {
	if ( *info > 0 ) return;

	/* Compute the reciprocal pivot growth factor *recip_pivot_growth. */
	*recip_pivot_growth = sPivotGrowth(A->ncol, AA, perm_c, L, U);
    }

    if ( options->ConditionNumber ) {
	/* Estimate the reciprocal of the condition number of A. */
	t0 = SuperLU_timer_();
	if ( notran ) {
	    *(unsigned char *)norm = '1';
	} else {
	    *(unsigned char *)norm = 'I';
	}
	anorm = slangs(norm, AA);
	sgscon(norm, L, U, anorm, rcond, stat, &info1);
	utime[RCOND] = SuperLU_timer_() - t0;
    }

    if ( nrhs > 0 ) { /* Solve the system */

	/* Scale and permute the right-hand side if equilibration
           and permutation from MC64 were performed. */
	if ( notran ) {
	    if ( rowequ ) {
		for (j = 0; j < nrhs; ++j)
		    for (i = 0; i < n; ++i)
		        Bmat[i + j*ldb] *= R[i];
	    }
	} else if ( colequ ) {
	    for (j = 0; j < nrhs; ++j)
		for (i = 0; i < n; ++i) {
	            Bmat[i + j*ldb] *= C[i];
		}
	}

	/* Compute the solution matrix X. */
	for (j = 0; j < nrhs; j++)  /* Save a copy of the right hand sides */
	    for (i = 0; i < B->nrow; i++)
		Xmat[i + j*ldx] = Bmat[i + j*ldb];

	t0 = SuperLU_timer_();
	sgstrs (trant, L, U, perm_c, perm_r, X, stat, &info1);
	utime[SOLVE] = SuperLU_timer_() - t0;

	/* Transform the solution matrix X to a solution of the original
	   system. */
	if ( notran ) {
	    if ( colequ ) {
		for (j = 0; j < nrhs; ++j)
		    for (i = 0; i < n; ++i) {
                        Xmat[i + j*ldx] *= C[i];
                    }
	    }
	} else { /* transposed system */
	    if ( rowequ ) {
	        for (j = 0; j < nrhs; ++j)
		    for (i = 0; i < A->nrow; ++i) {
              	        Xmat[i + j*ldx] *= R[i];
                    }
	    }
	}

    } /* end if nrhs > 0 */

    if ( options->ConditionNumber ) {
	/* The matrix is singular to working precision. */
	/* if ( *rcond < slamch_("E") && *info == 0) *info = A->ncol + 1; */
	if ( *rcond < smach("E") && *info == 0) *info = A->ncol + 1;
    }

    if ( nofact ) {
	ilu_sQuerySpace(L, U, mem_usage);
	Destroy_CompCol_Permuted(&AC);
    }
    if ( A->Stype == SLU_NR ) {
	Destroy_SuperMatrix_Store(AA);
	SUPERLU_FREE(AA);
    }

}